

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_tab.c
# Opt level: O1

int lj_tab_next(lua_State *L,GCtab *t,TValue *key)

{
  double dVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  Node *pNVar5;
  TValue *pTVar6;
  ulong uVar7;
  bool bVar8;
  
  uVar2 = (key->field_2).it;
  if (uVar2 < 0xfffeffff) {
    dVar1 = key->n;
    uVar4 = (uint)dVar1;
    if (uVar4 < t->asize) {
      if ((dVar1 == (double)(int)dVar1) && (!NAN(dVar1) && !NAN((double)(int)dVar1)))
      goto LAB_0010be59;
    }
  }
  if (uVar2 == 0xffffffff) {
    uVar4 = 0xffffffff;
  }
  else {
    pNVar5 = hashkey(t,key);
    do {
      uVar4 = (pNVar5->key).field_2.it;
      if (uVar4 == uVar2) {
        if (uVar4 < 0xfffffffd) {
          if (uVar4 < 0xfffeffff) goto LAB_0010be0d;
          bVar8 = (pNVar5->key).u32.lo == (key->u32).lo;
          goto LAB_0010be1f;
        }
LAB_0010be44:
        uVar4 = (int)((long)pNVar5 - (ulong)(t->node).ptr32 >> 3) * -0x55555555 + t->asize;
        goto LAB_0010be59;
      }
      if ((uVar2 < 0xffff0000) && (uVar4 < 0xffff0000)) {
LAB_0010be0d:
        bVar8 = key->n == (pNVar5->key).n;
LAB_0010be1f:
        if (bVar8) goto LAB_0010be44;
      }
      pNVar5 = (Node *)(ulong)(pNVar5->next).ptr32;
    } while (pNVar5 != (Node *)0x0);
    if (uVar2 != 0xfffe7fff) {
      lj_err_msg(L,LJ_ERR_NEXTIDX);
    }
    uVar4 = (key->u32).lo - 1;
  }
LAB_0010be59:
  uVar3 = t->asize;
  uVar2 = uVar4 + 1;
  do {
    uVar4 = uVar4 + 1;
    if (uVar3 <= uVar4) {
      uVar4 = uVar2 - uVar3;
      if (uVar2 < uVar3) {
        uVar4 = 0;
      }
      if (t->hmask < uVar4) {
        return 0;
      }
      uVar7 = (ulong)(t->node).ptr32;
      while (*(int *)(uVar7 + 4 + (ulong)uVar4 * 0x18) == -1) {
        uVar4 = uVar4 + 1;
        if (t->hmask < uVar4) {
          return 0;
        }
      }
      pTVar6 = (TValue *)(uVar7 + (ulong)uVar4 * 0x18);
      *key = pTVar6[1];
      goto LAB_0010bebb;
    }
  } while (*(int *)((ulong)(t->array).ptr32 + 4 + (ulong)uVar4 * 8) == -1);
  key->n = (double)(int)uVar4;
  pTVar6 = (TValue *)((ulong)(t->array).ptr32 + (ulong)uVar4 * 8);
LAB_0010bebb:
  key[1] = *pTVar6;
  return 1;
}

Assistant:

int lj_tab_next(lua_State *L, GCtab *t, TValue *key)
{
  uint32_t i = keyindex(L, t, key);  /* Find predecessor key index. */
  for (i++; i < t->asize; i++)  /* First traverse the array keys. */
    if (!tvisnil(arrayslot(t, i))) {
      setintV(key, i);
      copyTV(L, key+1, arrayslot(t, i));
      return 1;
    }
  for (i -= t->asize; i <= t->hmask; i++) {  /* Then traverse the hash keys. */
    Node *n = &noderef(t->node)[i];
    if (!tvisnil(&n->val)) {
      copyTV(L, key, &n->key);
      copyTV(L, key+1, &n->val);
      return 1;
    }
  }
  return 0;  /* End of traversal. */
}